

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void pinsrb_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  UInt8 UVar2;
  int iVar3;
  Int32 IVar4;
  OPTYPE *pMyOperand;
  
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
    if ((pMyDisasm->Prefix).OperandSize != '\x01') goto LAB_0012f02e;
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    (pMyDisasm->Reserved_).MemDecoration = 0x65;
    (pMyDisasm->Instruction).Category = 0x80027;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"pinsrb",7);
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    (pMyDisasm->Reserved_).Register_ = 4;
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
    pMyOperand = &pMyDisasm->Operand3;
    goto LAB_0012f0ca;
  }
  if (((pMyDisasm->Reserved_).VEX.pp != '\x01') || ((pMyDisasm->Reserved_).REX.W_ == '\x01')) {
LAB_0012f02e:
    failDecode(pMyDisasm);
    return;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpinsrb",8);
  UVar1 = (pMyDisasm->Reserved_).EVEX.state;
  if (UVar1 == '\x01') {
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
  }
  UVar2 = (pMyDisasm->Reserved_).VEX.L;
  if (UVar2 == '\0') {
    iVar3 = 0x110000;
    if (UVar1 == '\x01') {
      iVar3 = 0x140000;
    }
    IVar4 = 4;
LAB_0012f04a:
    (pMyDisasm->Instruction).Category = iVar3;
    (pMyDisasm->Reserved_).Register_ = IVar4;
  }
  else {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    if (UVar2 == '\x01') {
      iVar3 = (uint)(UVar1 == '\x01') * 0x20000 + 0x120000;
      IVar4 = 8;
      goto LAB_0012f04a;
    }
    if ((pMyDisasm->Reserved_).EVEX.LL == '\x02') {
      IVar4 = 0x10;
      iVar3 = 0x140000;
      goto LAB_0012f04a;
    }
  }
  (pMyDisasm->Reserved_).MemDecoration = 0xc9;
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  fillRegister((uint)(pMyDisasm->Reserved_).EVEX.V << 4 |
               ~(uint)(pMyDisasm->Reserved_).VEX.vvvv & 0xf,&pMyDisasm->Operand2,pMyDisasm);
  (pMyDisasm->Reserved_).Register_ = 0;
  (pMyDisasm->Reserved_).OperandSize = 0x20;
  decodeModrm(&pMyDisasm->Operand3,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  pMyOperand = &pMyDisasm->Operand4;
LAB_0012f0ca:
  getImmediat8(pMyOperand,pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ pinsrb_(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.REX.W_ == 1) {
        failDecode(pMyDisasm);
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpinsrb");
        #endif
        if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
        if (GV.VEX.L != 0) GV.ERROR_OPCODE = UD_;

        if (GV.VEX.L == 0) {
          pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
          GV.Register_ = SSE_REG;
        }
        else if (GV.VEX.L == 0x1) {
          pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX2_INSTRUCTION;
          GV.Register_ = AVX_REG;
        }
        else if (GV.EVEX.LL == 0x2) {
          pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
          GV.Register_ = AVX512_REG;
        }
        GV.MemDecoration = Arg3byte;
        decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
        fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand2, pMyDisasm);
        GV.Register_ = 0;
        GV.OperandSize = 32;
        decodeModrm(&pMyDisasm->Operand3, pMyDisasm);
        GV.EIP_ += GV.DECALAGE_EIP+2;

        getImmediat8(&pMyDisasm->Operand4, pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    /* ========== 0x66 */
    if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
      GV.OperandSize = GV.OriginalOperandSize;
      pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
      GV.MemDecoration = Arg2byte;
      pMyDisasm->Instruction.Category = SSE41_INSTRUCTION+INSERTION_EXTRACTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pinsrb");
      #endif
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      GV.Register_ = SSE_REG;
      decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
      getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
}